

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void PPRF_Eval(long msg)

{
  _Hash_node_base *p_Var1;
  ostream *poVar2;
  mapped_type *ppuVar3;
  _Hash_node_base *in_RDI;
  __hash_code __code;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  int j;
  long lVar6;
  key_type local_28;
  
  p_Var4 = keys._M_h._M_buckets[(ulong)in_RDI % keys._M_h._M_bucket_count];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var4->_M_nxt, p_Var5 = p_Var4, p_Var4->_M_nxt[1]._M_nxt != in_RDI)) {
    while (p_Var4 = p_Var1, p_Var1 = p_Var4->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var1[1]._M_nxt % keys._M_h._M_bucket_count !=
           (ulong)in_RDI % keys._M_h._M_bucket_count) ||
         (p_Var5 = p_Var4, p_Var1[1]._M_nxt == in_RDI)) goto LAB_00102993;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_00102993:
  if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"stop at punctured point !",0x19);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Original pseudo random value of  ",0x21);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is : ",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    lVar6 = 0;
    do {
      ppuVar3 = std::__detail::
                _Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&keys,&local_28);
      printf("%02x ",(ulong)(*ppuVar3)[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

void PPRF_Eval(long msg ){
    if(keys.find(msg) == keys.end()){
        cout << "stop at punctured point !" << endl;
    }
    else{
        cout <<"Original pseudo random value of  "<< msg << " is : " << endl;
        for (int j = 0 ; j <16; ++j){
            printf ( "%02x ",keys[msg][j]);
        }
        cout << endl ;
    }
}